

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SHA1.cpp
# Opt level: O0

void __thiscall CSHA1::Transform(CSHA1 *this,uint *state,uchar *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint e;
  uint d;
  uint c;
  uint b;
  uint a;
  uchar *buffer_local;
  uint *state_local;
  CSHA1 *this_local;
  
  uVar4 = *state;
  uVar2 = state[1];
  uVar5 = state[2];
  uVar3 = state[3];
  uVar1 = state[4];
  memcpy(this->m_block,buffer,0x40);
  uVar6 = this->m_block->l[0] << 0x18 | this->m_block->l[0] >> 8 & 0xff00ff00 |
          (this->m_block->l[0] & 0xff00) << 8 | this->m_block->l[0] >> 0x18;
  this->m_block->l[0] = uVar6;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar6 + 0x5a827999 + (uVar4 << 5 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 << 0x1e | uVar2 >> 2;
  uVar6 = this->m_block->l[1] << 0x18 | this->m_block->l[1] >> 8 & 0xff00ff00 |
          (this->m_block->l[1] & 0xff00) << 8 | this->m_block->l[1] >> 0x18;
  this->m_block->l[1] = uVar6;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar6 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 << 0x1e | uVar4 >> 2;
  uVar6 = this->m_block->l[2] << 0x18 | this->m_block->l[2] >> 8 & 0xff00ff00 |
          (this->m_block->l[2] & 0xff00) << 8 | this->m_block->l[2] >> 0x18;
  this->m_block->l[2] = uVar6;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar6 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = this->m_block->l[3] << 0x18 | this->m_block->l[3] >> 8 & 0xff00ff00 |
          (this->m_block->l[3] & 0xff00) << 8 | this->m_block->l[3] >> 0x18;
  this->m_block->l[3] = uVar6;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar6 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = this->m_block->l[4] << 0x18 | this->m_block->l[4] >> 8 & 0xff00ff00 |
          (this->m_block->l[4] & 0xff00) << 8 | this->m_block->l[4] >> 0x18;
  this->m_block->l[4] = uVar6;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar6 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = this->m_block->l[5] << 0x18 | this->m_block->l[5] >> 8 & 0xff00ff00 |
          (this->m_block->l[5] & 0xff00) << 8 | this->m_block->l[5] >> 0x18;
  this->m_block->l[5] = uVar6;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar6 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = this->m_block->l[6] << 0x18 | this->m_block->l[6] >> 8 & 0xff00ff00 |
          (this->m_block->l[6] & 0xff00) << 8 | this->m_block->l[6] >> 0x18;
  this->m_block->l[6] = uVar6;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar6 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = this->m_block->l[7] << 0x18 | this->m_block->l[7] >> 8 & 0xff00ff00 |
          (this->m_block->l[7] & 0xff00) << 8 | this->m_block->l[7] >> 0x18;
  this->m_block->l[7] = uVar6;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar6 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = this->m_block->l[8] << 0x18 | this->m_block->l[8] >> 8 & 0xff00ff00 |
          (this->m_block->l[8] & 0xff00) << 8 | this->m_block->l[8] >> 0x18;
  this->m_block->l[8] = uVar6;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar6 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = this->m_block->l[9] << 0x18 | this->m_block->l[9] >> 8 & 0xff00ff00 |
          (this->m_block->l[9] & 0xff00) << 8 | this->m_block->l[9] >> 0x18;
  this->m_block->l[9] = uVar6;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar6 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = this->m_block->l[10] << 0x18 | this->m_block->l[10] >> 8 & 0xff00ff00 |
          (this->m_block->l[10] & 0xff00) << 8 | this->m_block->l[10] >> 0x18;
  this->m_block->l[10] = uVar6;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar6 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = this->m_block->l[0xb] << 0x18 | this->m_block->l[0xb] >> 8 & 0xff00ff00 |
          (this->m_block->l[0xb] & 0xff00) << 8 | this->m_block->l[0xb] >> 0x18;
  this->m_block->l[0xb] = uVar6;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar6 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = this->m_block->l[0xc] << 0x18 | this->m_block->l[0xc] >> 8 & 0xff00ff00 |
          (this->m_block->l[0xc] & 0xff00) << 8 | this->m_block->l[0xc] >> 0x18;
  this->m_block->l[0xc] = uVar6;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar6 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = this->m_block->l[0xd] << 0x18 | this->m_block->l[0xd] >> 8 & 0xff00ff00 |
          (this->m_block->l[0xd] & 0xff00) << 8 | this->m_block->l[0xd] >> 0x18;
  this->m_block->l[0xd] = uVar6;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar6 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = this->m_block->l[0xe] << 0x18 | this->m_block->l[0xe] >> 8 & 0xff00ff00 |
          (this->m_block->l[0xe] & 0xff00) << 8 | this->m_block->l[0xe] >> 0x18;
  this->m_block->l[0xe] = uVar6;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar6 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = this->m_block->l[0xf] << 0x18 | this->m_block->l[0xf] >> 8 & 0xff00ff00 |
          (this->m_block->l[0xf] & 0xff00) << 8 | this->m_block->l[0xf] >> 0x18;
  this->m_block->l[0xf] = uVar6;
  uVar1 = (uVar2 & (uVar5 ^ uVar3) ^ uVar3) + uVar6 + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b) +
          uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^ this->m_block->l[0])
          << 1 | (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^
                 this->m_block->l[0]) >> 0x1f;
  this->m_block->l[0] = uVar6;
  uVar3 = (uVar4 & (uVar2 ^ uVar5) ^ uVar5) + uVar6 + 0x5a827999 + (uVar1 * 0x20 | uVar1 >> 0x1b) +
          uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^ this->m_block->l[1])
          << 1 | (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^
                 this->m_block->l[1]) >> 0x1f;
  this->m_block->l[1] = uVar6;
  uVar5 = (uVar1 & (uVar4 ^ uVar2) ^ uVar2) + uVar6 + 0x5a827999 + (uVar3 * 0x20 | uVar3 >> 0x1b) +
          uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^ this->m_block->l[2])
          << 1 | (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^
                 this->m_block->l[2]) >> 0x1f;
  this->m_block->l[2] = uVar6;
  uVar2 = (uVar3 & (uVar1 ^ uVar4) ^ uVar4) + uVar6 + 0x5a827999 + (uVar5 * 0x20 | uVar5 >> 0x1b) +
          uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^ this->m_block->l[3])
          << 1 | (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^
                 this->m_block->l[3]) >> 0x1f;
  this->m_block->l[3] = uVar6;
  uVar4 = (uVar5 & (uVar3 ^ uVar1) ^ uVar1) + uVar6 + 0x5a827999 + (uVar2 * 0x20 | uVar2 >> 0x1b) +
          uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^ this->m_block->l[4])
          << 1 | (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^
                 this->m_block->l[4]) >> 0x1f;
  this->m_block->l[4] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^ this->m_block->l[5])
          << 1 | (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^
                 this->m_block->l[5]) >> 0x1f;
  this->m_block->l[5] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^ this->m_block->l[6])
          << 1 | (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^
                 this->m_block->l[6]) >> 0x1f;
  this->m_block->l[6] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^ this->m_block->l[7])
          << 1 | (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^
                 this->m_block->l[7]) >> 0x1f;
  this->m_block->l[7] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^ this->m_block->l[8])
          << 1 | (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^
                 this->m_block->l[8]) >> 0x1f;
  this->m_block->l[8] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^ this->m_block->l[9])
          << 1 | (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^
                 this->m_block->l[9]) >> 0x1f;
  this->m_block->l[9] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^ this->m_block->l[10])
          << 1 | (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^
                 this->m_block->l[10]) >> 0x1f;
  this->m_block->l[10] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^ this->m_block->l[0xb]
          ) << 1 | (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^
                   this->m_block->l[0xb]) >> 0x1f;
  this->m_block->l[0xb] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^ this->m_block->l[0xc]
          ) << 1 | (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^
                   this->m_block->l[0xc]) >> 0x1f;
  this->m_block->l[0xc] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) << 1 |
          (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) >> 0x1f;
  this->m_block->l[0xd] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^ this->m_block->l[0xe]
          ) << 1 | (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^
                   this->m_block->l[0xe]) >> 0x1f;
  this->m_block->l[0xe] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^ this->m_block->l[0xf]
          ) << 1 | (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^
                   this->m_block->l[0xf]) >> 0x1f;
  this->m_block->l[0xf] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^ this->m_block->l[0])
          << 1 | (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^
                 this->m_block->l[0]) >> 0x1f;
  this->m_block->l[0] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^ this->m_block->l[1])
          << 1 | (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^
                 this->m_block->l[1]) >> 0x1f;
  this->m_block->l[1] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^ this->m_block->l[2])
          << 1 | (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^
                 this->m_block->l[2]) >> 0x1f;
  this->m_block->l[2] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^ this->m_block->l[3])
          << 1 | (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^
                 this->m_block->l[3]) >> 0x1f;
  this->m_block->l[3] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + 0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^ this->m_block->l[4])
          << 1 | (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^
                 this->m_block->l[4]) >> 0x1f;
  this->m_block->l[4] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + 0x6ed9eba1 + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^ this->m_block->l[5])
          << 1 | (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^
                 this->m_block->l[5]) >> 0x1f;
  this->m_block->l[5] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + 0x6ed9eba1 + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^ this->m_block->l[6])
          << 1 | (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^
                 this->m_block->l[6]) >> 0x1f;
  this->m_block->l[6] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + 0x6ed9eba1 + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^ this->m_block->l[7])
          << 1 | (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^
                 this->m_block->l[7]) >> 0x1f;
  this->m_block->l[7] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + 0x6ed9eba1 + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^ this->m_block->l[8])
          << 1 | (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^
                 this->m_block->l[8]) >> 0x1f;
  this->m_block->l[8] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^ this->m_block->l[9])
          << 1 | (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^
                 this->m_block->l[9]) >> 0x1f;
  this->m_block->l[9] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^ this->m_block->l[10])
          << 1 | (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^
                 this->m_block->l[10]) >> 0x1f;
  this->m_block->l[10] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^ this->m_block->l[0xb]
          ) << 1 | (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^
                   this->m_block->l[0xb]) >> 0x1f;
  this->m_block->l[0xb] = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^ this->m_block->l[0xc]
          ) << 1 | (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^
                   this->m_block->l[0xc]) >> 0x1f;
  this->m_block->l[0xc] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) << 1 |
          (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) >> 0x1f;
  this->m_block->l[0xd] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^ this->m_block->l[0xe]
          ) << 1 | (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^
                   this->m_block->l[0xe]) >> 0x1f;
  this->m_block->l[0xe] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^ this->m_block->l[0xf]
          ) << 1 | (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^
                   this->m_block->l[0xf]) >> 0x1f;
  this->m_block->l[0xf] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^ this->m_block->l[0])
          << 1 | (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^
                 this->m_block->l[0]) >> 0x1f;
  this->m_block->l[0] = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^ this->m_block->l[1])
          << 1 | (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^
                 this->m_block->l[1]) >> 0x1f;
  this->m_block->l[1] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^ this->m_block->l[2])
          << 1 | (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^
                 this->m_block->l[2]) >> 0x1f;
  this->m_block->l[2] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^ this->m_block->l[3])
          << 1 | (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^
                 this->m_block->l[3]) >> 0x1f;
  this->m_block->l[3] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^ this->m_block->l[4])
          << 1 | (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^
                 this->m_block->l[4]) >> 0x1f;
  this->m_block->l[4] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^ this->m_block->l[5])
          << 1 | (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^
                 this->m_block->l[5]) >> 0x1f;
  this->m_block->l[5] = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^ this->m_block->l[6])
          << 1 | (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^
                 this->m_block->l[6]) >> 0x1f;
  this->m_block->l[6] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^ this->m_block->l[7])
          << 1 | (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^
                 this->m_block->l[7]) >> 0x1f;
  this->m_block->l[7] = uVar6;
  uVar1 = ((uVar2 | uVar5) & uVar3 | uVar2 & uVar5) + uVar6 + -0x70e44324 +
          (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^ this->m_block->l[8])
          << 1 | (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^
                 this->m_block->l[8]) >> 0x1f;
  this->m_block->l[8] = uVar6;
  uVar3 = ((uVar4 | uVar2) & uVar5 | uVar4 & uVar2) + uVar6 + -0x70e44324 +
          (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^ this->m_block->l[9])
          << 1 | (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^
                 this->m_block->l[9]) >> 0x1f;
  this->m_block->l[9] = uVar6;
  uVar5 = ((uVar1 | uVar4) & uVar2 | uVar1 & uVar4) + uVar6 + -0x70e44324 +
          (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^ this->m_block->l[10])
          << 1 | (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^
                 this->m_block->l[10]) >> 0x1f;
  this->m_block->l[10] = uVar6;
  uVar2 = ((uVar3 | uVar1) & uVar4 | uVar3 & uVar1) + uVar6 + -0x70e44324 +
          (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^ this->m_block->l[0xb]
          ) << 1 | (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^
                   this->m_block->l[0xb]) >> 0x1f;
  this->m_block->l[0xb] = uVar6;
  uVar4 = ((uVar5 | uVar3) & uVar1 | uVar5 & uVar3) + uVar6 + -0x70e44324 +
          (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^ this->m_block->l[0xc]
          ) << 1 | (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^
                   this->m_block->l[0xc]) >> 0x1f;
  this->m_block->l[0xc] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) << 1 |
          (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) >> 0x1f;
  this->m_block->l[0xd] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^ this->m_block->l[0xe]
          ) << 1 | (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^
                   this->m_block->l[0xe]) >> 0x1f;
  this->m_block->l[0xe] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^ this->m_block->l[0xf]
          ) << 1 | (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^
                   this->m_block->l[0xf]) >> 0x1f;
  this->m_block->l[0xf] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^ this->m_block->l[0])
          << 1 | (this->m_block->l[0xd] ^ this->m_block->l[8] ^ this->m_block->l[2] ^
                 this->m_block->l[0]) >> 0x1f;
  this->m_block->l[0] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^ this->m_block->l[1])
          << 1 | (this->m_block->l[0xe] ^ this->m_block->l[9] ^ this->m_block->l[3] ^
                 this->m_block->l[1]) >> 0x1f;
  this->m_block->l[1] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^ this->m_block->l[2])
          << 1 | (this->m_block->l[0xf] ^ this->m_block->l[10] ^ this->m_block->l[4] ^
                 this->m_block->l[2]) >> 0x1f;
  this->m_block->l[2] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^ this->m_block->l[3])
          << 1 | (this->m_block->l[0] ^ this->m_block->l[0xb] ^ this->m_block->l[5] ^
                 this->m_block->l[3]) >> 0x1f;
  this->m_block->l[3] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^ this->m_block->l[4])
          << 1 | (this->m_block->l[1] ^ this->m_block->l[0xc] ^ this->m_block->l[6] ^
                 this->m_block->l[4]) >> 0x1f;
  this->m_block->l[4] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^ this->m_block->l[5])
          << 1 | (this->m_block->l[2] ^ this->m_block->l[0xd] ^ this->m_block->l[7] ^
                 this->m_block->l[5]) >> 0x1f;
  this->m_block->l[5] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^ this->m_block->l[6])
          << 1 | (this->m_block->l[3] ^ this->m_block->l[0xe] ^ this->m_block->l[8] ^
                 this->m_block->l[6]) >> 0x1f;
  this->m_block->l[6] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar2 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar6 = (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^ this->m_block->l[7])
          << 1 | (this->m_block->l[4] ^ this->m_block->l[0xf] ^ this->m_block->l[9] ^
                 this->m_block->l[7]) >> 0x1f;
  this->m_block->l[7] = uVar6;
  uVar3 = (uVar4 ^ uVar2 ^ uVar5) + uVar6 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar6 = (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^ this->m_block->l[8])
          << 1 | (this->m_block->l[5] ^ this->m_block->l[0] ^ this->m_block->l[10] ^
                 this->m_block->l[8]) >> 0x1f;
  this->m_block->l[8] = uVar6;
  uVar5 = (uVar1 ^ uVar4 ^ uVar2) + uVar6 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar1 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar6 = (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^ this->m_block->l[9])
          << 1 | (this->m_block->l[6] ^ this->m_block->l[1] ^ this->m_block->l[0xb] ^
                 this->m_block->l[9]) >> 0x1f;
  this->m_block->l[9] = uVar6;
  uVar2 = (uVar3 ^ uVar1 ^ uVar4) + uVar6 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar2;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar6 = (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^ this->m_block->l[10])
          << 1 | (this->m_block->l[7] ^ this->m_block->l[2] ^ this->m_block->l[0xc] ^
                 this->m_block->l[10]) >> 0x1f;
  this->m_block->l[10] = uVar6;
  uVar4 = (uVar5 ^ uVar3 ^ uVar1) + uVar6 + -0x359d3e2a + (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar4;
  uVar5 = uVar5 * 0x40000000 | uVar5 >> 2;
  uVar6 = (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^ this->m_block->l[0xb]
          ) << 1 | (this->m_block->l[8] ^ this->m_block->l[3] ^ this->m_block->l[0xd] ^
                   this->m_block->l[0xb]) >> 0x1f;
  this->m_block->l[0xb] = uVar6;
  uVar1 = (uVar2 ^ uVar5 ^ uVar3) + uVar6 + -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b) + uVar1;
  uVar6 = uVar2 * 0x40000000 | uVar2 >> 2;
  uVar2 = (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^ this->m_block->l[0xc]
          ) << 1 | (this->m_block->l[9] ^ this->m_block->l[4] ^ this->m_block->l[0xe] ^
                   this->m_block->l[0xc]) >> 0x1f;
  this->m_block->l[0xc] = uVar2;
  uVar3 = (uVar4 ^ uVar6 ^ uVar5) + uVar2 + -0x359d3e2a + (uVar1 * 0x20 | uVar1 >> 0x1b) + uVar3;
  uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
  uVar2 = (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) << 1 |
          (this->m_block->l[10] ^ this->m_block->l[5] ^ this->m_block->l[0xf] ^
          this->m_block->l[0xd]) >> 0x1f;
  this->m_block->l[0xd] = uVar2;
  uVar5 = (uVar1 ^ uVar4 ^ uVar6) + uVar2 + -0x359d3e2a + (uVar3 * 0x20 | uVar3 >> 0x1b) + uVar5;
  uVar2 = uVar1 * 0x40000000 | uVar1 >> 2;
  uVar1 = (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^ this->m_block->l[0xe]
          ) << 1 | (this->m_block->l[0xb] ^ this->m_block->l[6] ^ this->m_block->l[0] ^
                   this->m_block->l[0xe]) >> 0x1f;
  this->m_block->l[0xe] = uVar1;
  uVar6 = (uVar3 ^ uVar2 ^ uVar4) + uVar1 + -0x359d3e2a + (uVar5 * 0x20 | uVar5 >> 0x1b) + uVar6;
  uVar3 = uVar3 * 0x40000000 | uVar3 >> 2;
  uVar1 = (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^ this->m_block->l[0xf]
          ) << 1 | (this->m_block->l[0xc] ^ this->m_block->l[7] ^ this->m_block->l[1] ^
                   this->m_block->l[0xf]) >> 0x1f;
  this->m_block->l[0xf] = uVar1;
  *state = (uVar5 ^ uVar3 ^ uVar2) + uVar1 + -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b) + uVar4 +
           *state;
  state[1] = uVar6 + state[1];
  state[2] = (uVar5 * 0x40000000 | uVar5 >> 2) + state[2];
  state[3] = uVar3 + state[3];
  state[4] = uVar2 + state[4];
  return;
}

Assistant:

void CSHA1::Transform(UINT_32 *state, UINT_8 *buffer)
{
	// Copy state[] to working vars
	UINT_32 a = state[0], b = state[1], c = state[2], d = state[3], e = state[4];

	memcpy(m_block, buffer, 64);

	// 4 rounds of 20 operations each. Loop unrolled.
	_R0(a,b,c,d,e, 0); _R0(e,a,b,c,d, 1); _R0(d,e,a,b,c, 2); _R0(c,d,e,a,b, 3);
	_R0(b,c,d,e,a, 4); _R0(a,b,c,d,e, 5); _R0(e,a,b,c,d, 6); _R0(d,e,a,b,c, 7);
	_R0(c,d,e,a,b, 8); _R0(b,c,d,e,a, 9); _R0(a,b,c,d,e,10); _R0(e,a,b,c,d,11);
	_R0(d,e,a,b,c,12); _R0(c,d,e,a,b,13); _R0(b,c,d,e,a,14); _R0(a,b,c,d,e,15);
	_R1(e,a,b,c,d,16); _R1(d,e,a,b,c,17); _R1(c,d,e,a,b,18); _R1(b,c,d,e,a,19);
	_R2(a,b,c,d,e,20); _R2(e,a,b,c,d,21); _R2(d,e,a,b,c,22); _R2(c,d,e,a,b,23);
	_R2(b,c,d,e,a,24); _R2(a,b,c,d,e,25); _R2(e,a,b,c,d,26); _R2(d,e,a,b,c,27);
	_R2(c,d,e,a,b,28); _R2(b,c,d,e,a,29); _R2(a,b,c,d,e,30); _R2(e,a,b,c,d,31);
	_R2(d,e,a,b,c,32); _R2(c,d,e,a,b,33); _R2(b,c,d,e,a,34); _R2(a,b,c,d,e,35);
	_R2(e,a,b,c,d,36); _R2(d,e,a,b,c,37); _R2(c,d,e,a,b,38); _R2(b,c,d,e,a,39);
	_R3(a,b,c,d,e,40); _R3(e,a,b,c,d,41); _R3(d,e,a,b,c,42); _R3(c,d,e,a,b,43);
	_R3(b,c,d,e,a,44); _R3(a,b,c,d,e,45); _R3(e,a,b,c,d,46); _R3(d,e,a,b,c,47);
	_R3(c,d,e,a,b,48); _R3(b,c,d,e,a,49); _R3(a,b,c,d,e,50); _R3(e,a,b,c,d,51);
	_R3(d,e,a,b,c,52); _R3(c,d,e,a,b,53); _R3(b,c,d,e,a,54); _R3(a,b,c,d,e,55);
	_R3(e,a,b,c,d,56); _R3(d,e,a,b,c,57); _R3(c,d,e,a,b,58); _R3(b,c,d,e,a,59);
	_R4(a,b,c,d,e,60); _R4(e,a,b,c,d,61); _R4(d,e,a,b,c,62); _R4(c,d,e,a,b,63);
	_R4(b,c,d,e,a,64); _R4(a,b,c,d,e,65); _R4(e,a,b,c,d,66); _R4(d,e,a,b,c,67);
	_R4(c,d,e,a,b,68); _R4(b,c,d,e,a,69); _R4(a,b,c,d,e,70); _R4(e,a,b,c,d,71);
	_R4(d,e,a,b,c,72); _R4(c,d,e,a,b,73); _R4(b,c,d,e,a,74); _R4(a,b,c,d,e,75);
	_R4(e,a,b,c,d,76); _R4(d,e,a,b,c,77); _R4(c,d,e,a,b,78); _R4(b,c,d,e,a,79);

	// Add the working vars back into state
	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
	state[4] += e;

	// Wipe variables
#ifdef SHA1_WIPE_VARIABLES
	a = b = c = d = e = 0;
#endif
}